

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseXMLDecl(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlChar *str1;
  bool bVar2;
  xmlChar *version;
  xmlParserCtxtPtr ctxt_local;
  
  ctxt->input->standalone = -2;
  if (*ctxt->input->cur == '<') {
    ctxt->mlType = XML_TYPE_XML;
    ctxt->input->cur = ctxt->input->cur + 5;
    ctxt->input->col = ctxt->input->col + 5;
    if (*ctxt->input->cur == '\0') {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
  }
  else {
    ctxt->mlType = XML_TYPE_SML;
    ctxt->input->cur = ctxt->input->cur + 4;
    ctxt->input->col = ctxt->input->col + 4;
    if (*ctxt->input->cur == '\0') {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
  }
  if ((*ctxt->input->cur != ' ') &&
     (((*ctxt->input->cur < 9 || (10 < *ctxt->input->cur)) && (*ctxt->input->cur != '\r')))) {
    xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Blank needed after \'<?xml\'\n");
  }
  xmlSkipBlankChars(ctxt);
  str1 = xmlParseVersionInfo(ctxt);
  if (str1 == (xmlChar *)0x0) {
    xmlFatalErr(ctxt,XML_ERR_VERSION_MISSING,(char *)0x0);
  }
  else {
    iVar1 = xmlStrEqual(str1,"1.0");
    if (iVar1 == 0) {
      if ((ctxt->options & 0x20000U) == 0) {
        if ((*str1 == '1') && (str1[1] == '.')) {
          xmlWarningMsg(ctxt,XML_WAR_UNKNOWN_VERSION,"Unsupported version \'%s\'\n",str1,
                        (xmlChar *)0x0);
        }
        else {
          xmlFatalErrMsgStr(ctxt,XML_ERR_UNKNOWN_VERSION,"Unsupported version \'%s\'\n",str1);
        }
      }
      else {
        xmlFatalErrMsgStr(ctxt,XML_ERR_UNKNOWN_VERSION,"Unsupported version \'%s\'\n",str1);
      }
    }
    if (ctxt->version != (xmlChar *)0x0) {
      (*xmlFree)(ctxt->version);
    }
    ctxt->version = str1;
  }
  if (ctxt->mlType == XML_TYPE_XML) {
    if ((*ctxt->input->cur != ' ') &&
       (((*ctxt->input->cur < 9 || (10 < *ctxt->input->cur)) && (*ctxt->input->cur != '\r')))) {
      if ((*ctxt->input->cur == '?') && (ctxt->input->cur[1] == '>')) {
        ctxt->input->cur = ctxt->input->cur + 2;
        ctxt->input->col = ctxt->input->col + 2;
        if (*ctxt->input->cur != '\0') {
          return;
        }
        xmlParserInputGrow(ctxt->input,0xfa);
        return;
      }
      xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Blank needed here\n");
    }
  }
  else {
    if (*ctxt->input->cur == ';') {
      ctxt->input->cur = ctxt->input->cur + 1;
      ctxt->input->col = ctxt->input->col + 1;
      if (*ctxt->input->cur != '\0') {
        return;
      }
      xmlParserInputGrow(ctxt->input,0xfa);
      return;
    }
    if (*ctxt->input->cur == '\n') {
      return;
    }
    if (((*ctxt->input->cur != ' ') && ((*ctxt->input->cur < 9 || (10 < *ctxt->input->cur)))) &&
       (*ctxt->input->cur != '\r')) {
      xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Blank needed here\n");
    }
  }
  xmlParseEncodingDecl(ctxt);
  if (ctxt->errNo == 0x20) {
    return;
  }
  if (ctxt->instate != XML_PARSER_EOF) {
    if (ctxt->mlType == XML_TYPE_XML) {
      if ((((ctxt->input->encoding != (xmlChar *)0x0) && (*ctxt->input->cur != ' ')) &&
          ((*ctxt->input->cur < 9 || (10 < *ctxt->input->cur)))) && (*ctxt->input->cur != '\r')) {
        if ((*ctxt->input->cur == '?') && (ctxt->input->cur[1] == '>')) {
          ctxt->input->cur = ctxt->input->cur + 2;
          ctxt->input->col = ctxt->input->col + 2;
          if (*ctxt->input->cur != '\0') {
            return;
          }
          xmlParserInputGrow(ctxt->input,0xfa);
          return;
        }
        xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Blank needed here\n");
      }
    }
    else {
      if (*ctxt->input->cur == ';') {
        ctxt->input->cur = ctxt->input->cur + 1;
        ctxt->input->col = ctxt->input->col + 1;
        if (*ctxt->input->cur != '\0') {
          return;
        }
        xmlParserInputGrow(ctxt->input,0xfa);
        return;
      }
      if (*ctxt->input->cur == '\n') {
        return;
      }
      if (((*ctxt->input->cur != ' ') && ((*ctxt->input->cur < 9 || (10 < *ctxt->input->cur)))) &&
         (*ctxt->input->cur != '\r')) {
        xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Blank needed here\n");
      }
    }
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    xmlSkipBlankChars(ctxt);
    iVar1 = xmlParseSDDecl(ctxt);
    ctxt->input->standalone = iVar1;
    xmlSkipBlankChars(ctxt);
    if (ctxt->mlType == XML_TYPE_XML) {
      if ((*ctxt->input->cur == '?') && (ctxt->input->cur[1] == '>')) {
        ctxt->input->cur = ctxt->input->cur + 2;
        ctxt->input->col = ctxt->input->col + 2;
        if (*ctxt->input->cur == '\0') {
          xmlParserInputGrow(ctxt->input,0xfa);
        }
      }
      else if (*ctxt->input->cur == '>') {
        xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_FINISHED,(char *)0x0);
        xmlNextChar(ctxt);
      }
      else {
        xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_FINISHED,(char *)0x0);
        while( true ) {
          bVar2 = false;
          if (*ctxt->input->cur != '\0') {
            bVar2 = *ctxt->input->cur != '>';
          }
          if (!bVar2) break;
          ctxt->input->cur = ctxt->input->cur + 1;
        }
        xmlNextChar(ctxt);
      }
    }
    else if (*ctxt->input->cur == ';') {
      ctxt->input->cur = ctxt->input->cur + 1;
      ctxt->input->col = ctxt->input->col + 1;
      if (*ctxt->input->cur == '\0') {
        xmlParserInputGrow(ctxt->input,0xfa);
      }
    }
    else if (*ctxt->input->cur != '\n') {
      xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_FINISHED,(char *)0x0);
      while( true ) {
        bVar2 = false;
        if ((((*ctxt->input->cur != '\0') && (bVar2 = false, *ctxt->input->cur != '\n')) &&
            (bVar2 = false, *ctxt->input->cur != ';')) && (bVar2 = false, *ctxt->input->cur != '}'))
        {
          bVar2 = *ctxt->input->cur != ']';
        }
        if (!bVar2) break;
        ctxt->input->cur = ctxt->input->cur + 1;
      }
      xmlNextChar(ctxt);
    }
    return;
  }
  return;
}

Assistant:

void
xmlParseXMLDecl(xmlParserCtxtPtr ctxt) {
    xmlChar *version;

    DEBUG_ENTER(("xmlParseXMLDecl(%s);\n", dbgCtxt(ctxt)));

    /*
     * This value for standalone indicates that the document has an
     * XML declaration but it does not have a standalone attribute.
     * It will be overwritten later if a standalone attribute is found.
     */
    ctxt->input->standalone = -2;

    /*
     * We know that '<?xml' is here.
     */
    if (RAW == '<') {						/* XML */
    	ctxt->mlType = XML_TYPE_XML;
	SKIP(5);
    } else {							/* SML */
    	ctxt->mlType = XML_TYPE_SML;
	SKIP(4); /* SML only has '?xml' */
    }

    if (!IS_BLANK_CH(RAW)) {
	xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
	               "Blank needed after '<?xml'\n");
    }
    SKIP_BLANKS;

    /*
     * We must have the VersionInfo here.
     */
    version = xmlParseVersionInfo(ctxt);
    if (version == NULL) {
	xmlFatalErr(ctxt, XML_ERR_VERSION_MISSING, NULL);
    } else {
	if (!xmlStrEqual(version, (const xmlChar *) XML_DEFAULT_VERSION)) {
	    /*
	     * Changed here for XML-1.0 5th edition
	     */
	    if (ctxt->options & XML_PARSE_OLD10) {
		xmlFatalErrMsgStr(ctxt, XML_ERR_UNKNOWN_VERSION,
			          "Unsupported version '%s'\n",
			          version);
	    } else {
	        if ((version[0] == '1') && ((version[1] == '.'))) {
		    xmlWarningMsg(ctxt, XML_WAR_UNKNOWN_VERSION,
		                  "Unsupported version '%s'\n",
				  version, NULL);
		} else {
		    xmlFatalErrMsgStr(ctxt, XML_ERR_UNKNOWN_VERSION,
				      "Unsupported version '%s'\n",
				      version);
		}
	    }
	}
	if (ctxt->version != NULL)
	    xmlFree((void *) ctxt->version);
	ctxt->version = version;
    }

    /*
     * We may have the encoding declaration
     */
    if (ISXML) {						/* XML */
	if (!IS_BLANK_CH(RAW)) {
	    if ((RAW == '?') && (NXT(1) == '>')) {
		SKIP(2);
		RETURN();
	    }
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED, "Blank needed here\n");
	}
    } else {							/* SML */
    	if (RAW == ';') { SKIP(1); RETURN(); }
    	if (RAW == '\n') RETURN();
	if (!IS_BLANK_CH(RAW)) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED, "Blank needed here\n");
	}
    }
    xmlParseEncodingDecl(ctxt);
    if ((ctxt->errNo == XML_ERR_UNSUPPORTED_ENCODING) ||
         (ctxt->instate == XML_PARSER_EOF)) {
	/*
	 * The XML REC instructs us to stop parsing right here
	 */
        RETURN();
    }

    /*
     * We may have the standalone status.
     */
    if (ISXML) {						/* XML */
	if ((ctxt->input->encoding != NULL) && (!IS_BLANK_CH(RAW))) {
	    if ((RAW == '?') && (NXT(1) == '>')) {
		SKIP(2);
		RETURN();
	    }
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED, "Blank needed here\n");
	}
    } else {							/* SML */
    	if (RAW == ';') { SKIP(1); RETURN(); }
    	if (RAW == '\n') RETURN();
	if (!IS_BLANK_CH(RAW)) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED, "Blank needed here\n");
	}
    }

    /*
     * We can grow the input buffer freely at that point
     */
    GROW;

    SKIP_BLANKS;
    ctxt->input->standalone = xmlParseSDDecl(ctxt);

    SKIP_BLANKS;
    if (ISXML) {						/* XML */
	if ((RAW == '?') && (NXT(1) == '>')) {
	    SKIP(2);
	} else if (RAW == '>') {
	    /* Deprecated old WD ... */
	    xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_FINISHED, NULL);
	    NEXT;
	} else {
	    xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_FINISHED, NULL);
	    MOVETO_ENDTAG(CUR_PTR);
	    NEXT;
	}
    } else {							/* SML */
    	if (RAW == ';') { SKIP(1); RETURN(); }
    	if (RAW == '\n') RETURN();
	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_FINISHED, NULL);
	MOVETO_ENDSMLTAG(CUR_PTR);
	NEXT;
    }
    RETURN();
}